

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::Recover(DBImpl *this,VersionEdit *edit,bool *save_manifest)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  char *pcVar7;
  long in_RSI;
  Status *in_RDI;
  size_t i_1;
  char buf [50];
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  FileType type;
  uint64_t number;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> expected;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  uint64_t prev_log;
  uint64_t min_log;
  SequenceNumber max_sequence;
  Status s;
  bool *in_stack_000002a0;
  VersionSet *in_stack_000002a8;
  string *in_stack_fffffffffffffd88;
  Status *rhs;
  Slice *in_stack_fffffffffffffd90;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffd98;
  VersionSet *pVVar8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffda0;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffdc8;
  ulong uVar9;
  ulong local_1f8;
  string local_1d8 [32];
  FileType *in_stack_fffffffffffffe48;
  uint64_t *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  char local_198 [56];
  ulong local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  int local_13c;
  ulong local_138;
  DBImpl *in_stack_fffffffffffffef8;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  uint64_t local_e0;
  uint64_t local_d8;
  Status local_d0 [7];
  VersionEdit *in_stack_ffffffffffffff68;
  bool *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff7f;
  uint64_t in_stack_ffffffffffffff80;
  DBImpl *in_stack_ffffffffffffff88;
  SequenceNumber *in_stack_ffffffffffffffa0;
  string local_50 [32];
  Status local_30;
  undefined1 local_28 [40];
  
  port::Mutex::AssertHeld((Mutex *)(in_RSI + 0x8c8));
  (**(code **)(**(long **)(in_RSI + 8) + 0x48))(local_28,*(long **)(in_RSI + 8),in_RSI + 0x898);
  Status::~Status((Status *)in_stack_fffffffffffffd90);
  plVar1 = *(long **)(in_RSI + 8);
  LockFileName(in_stack_fffffffffffffd88);
  (**(code **)(*plVar1 + 0x68))(&local_30,plVar1,local_50,in_RSI + 0x8c0);
  std::__cxx11::string::~string(local_50);
  bVar2 = Status::ok(&local_30);
  if (!bVar2) {
    Status::Status(in_RDI,&local_30);
    goto LAB_0010f8fb;
  }
  pVVar8 = *(VersionSet **)(in_RSI + 8);
  CurrentFileName(in_stack_fffffffffffffd88);
  bVar3 = (*(code *)pVVar8->env_[6]._vptr_Env)(pVVar8,&stack0xffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  if (((bVar3 ^ 0xff) & 1) == 0) {
    if ((*(byte *)(in_RSI + 0x39) & 1) != 0) {
      Slice::Slice(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      Slice::Slice(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
      Status::InvalidArgument
                ((Slice *)in_stack_fffffffffffffd98._M_current,in_stack_fffffffffffffd90);
      goto LAB_0010f8fb;
    }
  }
  else {
    if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
      Slice::Slice(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      Slice::Slice(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
      Status::InvalidArgument
                ((Slice *)in_stack_fffffffffffffd98._M_current,in_stack_fffffffffffffd90);
      goto LAB_0010f8fb;
    }
    NewDB(in_stack_fffffffffffffef8);
    Status::operator=((Status *)in_stack_fffffffffffffd90,(Status *)in_stack_fffffffffffffd88);
    Status::~Status((Status *)in_stack_fffffffffffffd90);
    bVar2 = Status::ok(&local_30);
    if (!bVar2) {
      Status::Status(in_RDI,&local_30);
      goto LAB_0010f8fb;
    }
  }
  VersionSet::Recover(in_stack_000002a8,in_stack_000002a0);
  Status::operator=((Status *)in_stack_fffffffffffffd90,(Status *)in_stack_fffffffffffffd88);
  Status::~Status((Status *)in_stack_fffffffffffffd90);
  bVar2 = Status::ok(&local_30);
  if (bVar2) {
    local_d0[0].state_ = (char *)0x0;
    local_d8 = VersionSet::LogNumber(*(VersionSet **)(in_RSI + 0xa20));
    local_e0 = VersionSet::PrevLogNumber(*(VersionSet **)(in_RSI + 0xa20));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x10f47b);
    (**(code **)(**(long **)(in_RSI + 8) + 0x38))
              (local_100,*(long **)(in_RSI + 8),in_RSI + 0x898,&local_f8);
    Status::operator=((Status *)in_stack_fffffffffffffd90,(Status *)in_stack_fffffffffffffd88);
    Status::~Status((Status *)in_stack_fffffffffffffd90);
    bVar2 = Status::ok(&local_30);
    if (bVar2) {
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 0x10f503);
      VersionSet::AddLiveFiles(pVVar8,in_stack_fffffffffffffdc8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10f529);
      local_160 = 0;
      while (uVar9 = local_160,
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&local_f8), uVar9 < sVar4) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_f8,local_160);
        bVar2 = ParseFileName(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe48);
        if (((bVar2) &&
            (std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             erase((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffd90,(key_type *)in_stack_fffffffffffffd88), local_13c == 0)
            ) && ((local_d8 <= local_138 || (local_138 == local_e0)))) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffda0._M_current,in_stack_fffffffffffffd98._M_current);
        }
        local_160 = local_160 + 1;
      }
      bVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              empty((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    0x10f615);
      if (bVar2) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffd88);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffd88);
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        for (local_1f8 = 0;
            sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_158),
            local_1f8 < sVar4; local_1f8 = local_1f8 + 1) {
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_158,local_1f8);
          in_stack_fffffffffffffda0._M_current = (unsigned_long *)*pvVar6;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_158);
          rhs = local_d0;
          RecoverLogFile(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         (bool)in_stack_ffffffffffffff7f,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffffa0);
          Status::operator=((Status *)in_stack_fffffffffffffd90,rhs);
          Status::~Status((Status *)in_stack_fffffffffffffd90);
          bVar2 = Status::ok(&local_30);
          if (!bVar2) {
            Status::Status(in_RDI,&local_30);
            goto LAB_0010f8d4;
          }
          pVVar8 = *(VersionSet **)(in_RSI + 0xa20);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_158,local_1f8);
          VersionSet::MarkFileNumberUsed(pVVar8,*pvVar6);
        }
        pcVar7 = (char *)VersionSet::LastSequence(*(VersionSet **)(in_RSI + 0xa20));
        if (pcVar7 < local_d0[0].state_) {
          VersionSet::SetLastSequence(*(VersionSet **)(in_RSI + 0xa20),(uint64_t)local_d0[0].state_)
          ;
        }
        Status::OK();
      }
      else {
        sVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )0x10f637);
        snprintf(local_198,0x32,"%d missing files; e.g.",sVar5 & 0xffffffff);
        Slice::Slice(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffd88);
        std::_Rb_tree_const_iterator<unsigned_long>::operator*
                  ((_Rb_tree_const_iterator<unsigned_long> *)0x10f698);
        TableFileName((string *)in_stack_fffffffffffffd98._M_current,
                      (uint64_t)in_stack_fffffffffffffd90);
        Slice::Slice(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        Status::Corruption((Slice *)in_stack_fffffffffffffd98._M_current,in_stack_fffffffffffffd90);
        std::__cxx11::string::~string(local_1d8);
      }
LAB_0010f8d4:
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffda0._M_current);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 0x10f8ee);
    }
    else {
      Status::Status(in_RDI,&local_30);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffda0._M_current);
  }
  else {
    Status::Status(in_RDI,&local_30);
  }
LAB_0010f8fb:
  Status::~Status((Status *)in_stack_fffffffffffffd90);
  return (Status)(char *)in_RDI;
}

Assistant:

Status DBImpl::Recover(VersionEdit* edit, bool* save_manifest) {
  mutex_.AssertHeld();

  // Ignore error from CreateDir since the creation of the DB is
  // committed only when the descriptor is created, and this directory
  // may already exist from a previous failed creation attempt.
  env_->CreateDir(dbname_);
  assert(db_lock_ == nullptr);
  Status s = env_->LockFile(LockFileName(dbname_), &db_lock_);
  if (!s.ok()) {
    return s;
  }

  if (!env_->FileExists(CurrentFileName(dbname_))) {
    if (options_.create_if_missing) {
      s = NewDB();
      if (!s.ok()) {
        return s;
      }
    } else {
      return Status::InvalidArgument(
          dbname_, "does not exist (create_if_missing is false)");
    }
  } else {
    if (options_.error_if_exists) {
      return Status::InvalidArgument(dbname_,
                                     "exists (error_if_exists is true)");
    }
  }

  s = versions_->Recover(save_manifest);
  if (!s.ok()) {
    return s;
  }
  SequenceNumber max_sequence(0);

  // Recover from all newer log files than the ones named in the
  // descriptor (new log files may have been added by the previous
  // incarnation without registering them in the descriptor).
  //
  // Note that PrevLogNumber() is no longer used, but we pay
  // attention to it in case we are recovering a database
  // produced by an older version of leveldb.
  const uint64_t min_log = versions_->LogNumber();
  const uint64_t prev_log = versions_->PrevLogNumber();
  std::vector<std::string> filenames;
  s = env_->GetChildren(dbname_, &filenames);
  if (!s.ok()) {
    return s;
  }
  std::set<uint64_t> expected;
  versions_->AddLiveFiles(&expected);
  uint64_t number;
  FileType type;
  std::vector<uint64_t> logs;
  for (size_t i = 0; i < filenames.size(); i++) {
    if (ParseFileName(filenames[i], &number, &type)) {
      expected.erase(number);
      if (type == kLogFile && ((number >= min_log) || (number == prev_log)))
        logs.push_back(number);
    }
  }
  if (!expected.empty()) {
    char buf[50];
    snprintf(buf, sizeof(buf), "%d missing files; e.g.",
             static_cast<int>(expected.size()));
    return Status::Corruption(buf, TableFileName(dbname_, *(expected.begin())));
  }

  // Recover in the order in which the logs were generated
  std::sort(logs.begin(), logs.end());
  for (size_t i = 0; i < logs.size(); i++) {
    s = RecoverLogFile(logs[i], (i == logs.size() - 1), save_manifest, edit,
                       &max_sequence);
    if (!s.ok()) {
      return s;
    }

    // The previous incarnation may not have written any MANIFEST
    // records after allocating this log number.  So we manually
    // update the file number allocation counter in VersionSet.
    versions_->MarkFileNumberUsed(logs[i]);
  }

  if (versions_->LastSequence() < max_sequence) {
    versions_->SetLastSequence(max_sequence);
  }

  return Status::OK();
}